

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> * __thiscall
QPDF::processXRefIndex
          (pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           *__return_storage_ptr__,QPDF *this,QPDFObjectHandle *dict,int max_num_entries,
          function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged)

{
  bool bVar1;
  int iVar2;
  longlong __val;
  longlong __val_00;
  QPDFExc *pQVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer this_01;
  uint __val_01;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  basic_string_view<char,_std::char_traits<char>_> __args_01;
  basic_string_view<char,_std::char_traits<char>_> __args_02;
  basic_string_view<char,_std::char_traits<char>_> __args_03;
  basic_string_view<char,_std::char_traits<char>_> __args_04;
  basic_string_view<char,_std::char_traits<char>_> __args_05;
  initializer_list<std::pair<int,_int>_> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  ulong local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> *local_140;
  QPDFObjectHandle Index_obj;
  string local_128;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> indx;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> index_vec;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_140 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"/Size",(allocator<char> *)&local_128);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_160,(string *)dict);
  iVar2 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"/Index",(allocator<char> *)&local_160);
  QPDFObjectHandle::getKey(&Index_obj,(string *)dict);
  std::__cxx11::string::~string((string *)&local_188);
  bVar1 = QPDFObjectHandle::isArray(&Index_obj);
  if (bVar1) {
    indx.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indx.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indx.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    QPDFObjectHandle::getArrayAsVector(&index_vec,&Index_obj);
    if (((ulong)((long)index_vec.
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)index_vec.
                      super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                      _M_impl.super__Vector_impl_data._M_start) < 0x11) ||
       (((long)index_vec.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)index_vec.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_start & 0x10U) != 0)) {
      pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
      __args_05._M_str = "Cross-reference stream\'s /Index has an invalid number of values";
      __args_05._M_len = 0x3f;
      std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                (pQVar3,damaged,__args_05);
      __cxa_throw(pQVar3,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    local_168 = 0;
    __val = 0;
    __val_01 = 0;
    for (this_01 = index_vec.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_01 !=
        index_vec.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
      bVar1 = QPDFObjectHandle::isInteger(this_01);
      if (!bVar1) {
        pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
        std::__cxx11::to_string(&local_128,__val_01);
        std::operator+(&local_160,"Cross-reference stream\'s /Index\'s item ",&local_128);
        std::operator+(&local_188,&local_160," is not an integer");
        __args._M_str._4_4_ = local_188._M_dataplus._M_p._4_4_;
        __args._M_str._0_4_ = local_188._M_dataplus._M_p._0_4_;
        __args._M_len = local_188._M_string_length;
        std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                  (pQVar3,damaged,__args);
        __cxa_throw(pQVar3,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      if ((__val_01 & 1) == 0) {
        __val = QPDFObjectHandle::getIntValue(this_01);
        if (__val < 0) {
          pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
          __args_01._M_str = "Cross-reference stream\'s /Index contains a negative object id";
          __args_01._M_len = 0x3d;
          std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                    (pQVar3,damaged,__args_01);
LAB_001e3b8b:
          __cxa_throw(pQVar3,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        if (max_num_entries < __val) {
          pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
          __args_02._M_str =
               "Cross-reference stream\'s /Index contains an impossibly large object id";
          __args_02._M_len = 0x46;
          std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                    (pQVar3,damaged,__args_02);
          goto LAB_001e3b8b;
        }
      }
      else {
        __val_00 = QPDFObjectHandle::getIntValue(this_01);
        if (__val_00 < 1) {
          pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
          std::__cxx11::to_string(&local_128,__val_00);
          std::operator+(&local_160,"Cross-reference stream section claims to contain ",&local_128);
          std::operator+(&local_188,&local_160," entries");
          __args_03._M_str._4_4_ = local_188._M_dataplus._M_p._4_4_;
          __args_03._M_str._0_4_ = local_188._M_dataplus._M_p._0_4_;
          __args_03._M_len = local_188._M_string_length;
          std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                    (pQVar3,damaged,__args_03);
          __cxa_throw(pQVar3,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        if ((max_num_entries - __val_00 < __val) || (max_num_entries - (int)local_168 < __val_00)) {
          pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
          std::__cxx11::to_string(&local_90,__val);
          std::operator+(&local_70,"Cross-reference stream claims to contain too many entries: ",
                         &local_90);
          std::operator+(&local_50,&local_70," ");
          std::__cxx11::to_string(&local_b0,max_num_entries);
          std::operator+(&local_128,&local_50,&local_b0);
          std::operator+(&local_160,&local_128," ");
          std::__cxx11::to_string(&local_d0,(int)local_168);
          std::operator+(&local_188,&local_160,&local_d0);
          __args_00._M_str._4_4_ = local_188._M_dataplus._M_p._4_4_;
          __args_00._M_str._0_4_ = local_188._M_dataplus._M_p._0_4_;
          __args_00._M_len = local_188._M_string_length;
          std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                    (pQVar3,damaged,__args_00);
          __cxa_throw(pQVar3,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        local_188._M_dataplus._M_p._0_4_ = (undefined4)__val;
        local_160._M_dataplus._M_p._0_4_ = (int)__val_00;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&indx,
                   (int *)&local_188,(int *)&local_160);
        local_168 = (ulong)(uint)((int)local_168 + (int)__val_00);
      }
      __val_01 = __val_01 + 1;
    }
    local_140->first = (int)local_168;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (&local_140->second,&indx);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&index_vec);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&indx;
  }
  else {
    bVar1 = QPDFObjectHandle::isNull(&Index_obj);
    if (!bVar1) {
      pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
      __args_04._M_str = "Cross-reference stream does not have a proper /Index key";
      __args_04._M_len = 0x38;
      std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                (pQVar3,damaged,__args_04);
      __cxa_throw(pQVar3,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    local_160._M_dataplus._M_p._0_4_ = 0;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_160;
    local_160._M_dataplus._M_p._4_4_ = iVar2;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_188,__l,
               (allocator_type *)&local_128);
    local_140->first = iVar2;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (&local_140->second,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_188);
    this_00 = &local_188;
  }
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&Index_obj.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return local_140;
}

Assistant:

std::pair<int, std::vector<std::pair<int, int>>>
QPDF::processXRefIndex(
    QPDFObjectHandle& dict, int max_num_entries, std::function<QPDFExc(std::string_view)> damaged)
{
    auto size = dict.getKey("/Size").getIntValueAsInt();
    auto Index_obj = dict.getKey("/Index");

    if (Index_obj.isArray()) {
        std::vector<std::pair<int, int>> indx;
        int num_entries = 0;
        auto index_vec = Index_obj.getArrayAsVector();
        if ((index_vec.size() % 2) || index_vec.size() < 2) {
            throw damaged("Cross-reference stream's /Index has an invalid number of values");
        }

        int i = 0;
        long long first = 0;
        for (auto& val: index_vec) {
            if (val.isInteger()) {
                if (i % 2) {
                    auto count = val.getIntValue();
                    if (count <= 0) {
                        throw damaged(
                            "Cross-reference stream section claims to contain " +
                            std::to_string(count) + " entries");
                    }
                    // We are guarding against the possibility of num_entries * entry_size
                    // overflowing. We are not checking that entries are in ascending order as
                    // required by the spec, which probably should generate a warning. We are also
                    // not checking that for each subsection first object number + number of entries
                    // <= /Size. The spec requires us to ignore object number > /Size.
                    if (first > (max_num_entries - count) ||
                        count > (max_num_entries - num_entries)) {
                        throw damaged(
                            "Cross-reference stream claims to contain too many entries: " +
                            std::to_string(first) + " " + std::to_string(max_num_entries) + " " +
                            std::to_string(num_entries));
                    }
                    indx.emplace_back(static_cast<int>(first), static_cast<int>(count));
                    num_entries += static_cast<int>(count);
                } else {
                    first = val.getIntValue();
                    if (first < 0) {
                        throw damaged(
                            "Cross-reference stream's /Index contains a negative object id");
                    } else if (first > max_num_entries) {
                        throw damaged(
                            "Cross-reference stream's /Index contains an impossibly "
                            "large object id");
                    }
                }
            } else {
                throw damaged(
                    "Cross-reference stream's /Index's item " + std::to_string(i) +
                    " is not an integer");
            }
            i++;
        }
        QTC::TC("qpdf", "QPDF xref /Index is array", index_vec.size() == 2 ? 0 : 1);
        return {num_entries, indx};
    } else if (Index_obj.isNull()) {
        QTC::TC("qpdf", "QPDF xref /Index is null");
        return {size, {{0, size}}};
    } else {
        throw damaged("Cross-reference stream does not have a proper /Index key");
    }
}